

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

void iq3xs_init_impl(int grid_size)

{
  uint32_t uVar1;
  byte bVar2;
  byte bVar6;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  undefined1 auVar14 [14];
  undefined1 auVar15 [15];
  undefined1 auVar16 [14];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined8 uVar27;
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  unkuint9 Var30;
  undefined1 auVar31 [11];
  undefined1 auVar32 [13];
  undefined1 auVar33 [14];
  undefined6 uVar34;
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [15];
  undefined1 auVar38 [11];
  undefined1 auVar39 [13];
  undefined1 auVar40 [14];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  unkbyte10 Var45;
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  uint6 uVar48;
  int k;
  uint32_t *puVar49;
  ulong uVar50;
  int *__s;
  int *__base;
  ulong uVar51;
  ulong uVar52;
  long lVar53;
  int iVar54;
  int iVar55;
  uint uVar56;
  int i_1;
  int iVar57;
  uint16_t *puVar58;
  ulong __nmemb;
  bool bVar59;
  ushort uVar60;
  ushort uVar61;
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  ushort uVar62;
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 uVar75;
  uint uVar77;
  uint uVar79;
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  short sVar78;
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  uint uVar81;
  uint uVar82;
  undefined1 auVar80 [16];
  undefined4 uVar84;
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined2 uVar76;
  
  if ((grid_size != 0x100) && (grid_size != 0x200)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-quants.c"
               ,0xd14,"GGML_ASSERT(%s) failed","grid_size == 256 || grid_size == 512");
  }
  bVar59 = grid_size != 0x100;
  if (iq3_data[bVar59].grid != (uint32_t *)0x0) {
    return;
  }
  __nmemb = (ulong)(uint)grid_size;
  puVar58 = iq3xs_init_impl::kgrid_512;
  if (grid_size == 0x100) {
    puVar58 = iq3xs_init_impl::kgrid_256;
  }
  uVar56 = grid_size == 0x100 ^ 3;
  puVar49 = (uint32_t *)malloc(__nmemb * 4);
  uVar50 = 0;
  do {
    uVar62 = puVar58[uVar50];
    uVar12 = uVar62 >> 9;
    uVar60 = uVar62 & 0xff;
    uVar10 = uVar62 >> 3 & 0xff;
    uVar11 = uVar62 >> 6 & 0xff;
    bVar2 = (uVar60 != 0) * (uVar60 < 0x100) * (char)uVar62 - (0xff < uVar60);
    bVar3 = (uVar10 != 0) * (uVar10 < 0x100) * (char)(uVar62 >> 3) - (0xff < uVar10);
    bVar4 = (uVar11 != 0) * (uVar11 < 0x100) * (char)(uVar62 >> 6) - (0xff < uVar11);
    bVar5 = (uVar12 != 0) * (uVar12 < 0x100) * (byte)(uVar62 >> 9) - (0xff < uVar12);
    puVar49[uVar50] =
         CONCAT13(((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)) * '\x02',
                  CONCAT12(((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4)) * '\x02',
                           CONCAT11(((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3)) *
                                    '\x02',((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2))
                                           * '\x02'))) & (uint)DAT_0014e9a0 | (uint)DAT_0014e6c0;
    uVar50 = uVar50 + 1;
  } while (__nmemb != uVar50);
  iq3_data[bVar59].grid = puVar49;
  __s = (int *)malloc(0x4000);
  iq3_data[bVar59].map = __s;
  memset(__s,0xff,0x4000);
  uVar50 = 0;
  do {
    uVar1 = puVar49[uVar50];
    auVar83._0_2_ = ((ushort)uVar1 & 0xff) - 1;
    auVar83._2_2_ = (byte)(uVar1 >> 8) - 1;
    auVar83._4_2_ = (byte)(uVar1 >> 0x10) - 1;
    auVar83._6_2_ = (byte)(uVar1 >> 0x18) - 1;
    auVar83._8_2_ = 0xffff;
    auVar83._10_2_ = 0xffff;
    auVar83._12_2_ = 0xffff;
    auVar83._14_2_ = 0xffff;
    auVar85._0_2_ = auVar83._0_2_ >> 0xf;
    auVar85._2_2_ = auVar83._2_2_ >> 0xf;
    auVar85._4_2_ = auVar83._4_2_ >> 0xf;
    auVar85._6_2_ = auVar83._6_2_ >> 0xf;
    auVar85._8_2_ = 1;
    auVar85._10_2_ = 1;
    auVar85._12_2_ = 1;
    auVar85._14_2_ = 1;
    auVar85 = auVar85 & auVar83;
    auVar83 = psraw(auVar83,1);
    auVar80._0_8_ =
         CONCAT26((auVar83._6_2_ + auVar85._6_2_) * 0x200,
                  CONCAT24((auVar83._4_2_ + auVar85._4_2_) * 0x40,
                           CONCAT22((auVar83._2_2_ + auVar85._2_2_) * 8,
                                    auVar83._0_2_ + auVar85._0_2_)));
    auVar80._8_8_ = 0;
    uVar84 = (undefined4)(auVar80._0_8_ >> 0x20);
    auVar86._4_4_ = uVar84;
    auVar86._0_4_ = uVar84;
    auVar86._8_4_ = uVar84;
    auVar86._12_4_ = uVar84;
    __s[(ushort)(SUB162(auVar86 | auVar80,2) | SUB162(auVar86 | auVar80,0))] = (int)uVar50;
    uVar50 = uVar50 + 1;
  } while (__nmemb != uVar50);
  __base = (int *)malloc((long)(grid_size * 2) << 2);
  uVar50 = 0;
  iVar57 = 0;
  iVar54 = 0;
  do {
    if (__s[uVar50] < 0) {
      uVar77 = (uint)uVar50;
      uVar79 = uVar77 >> 9;
      uVar81 = uVar77 >> 6;
      uVar77 = uVar77 >> 3;
      uVar62 = (ushort)uVar50 & 0xff;
      uVar10 = (ushort)uVar77 & 0xff;
      uVar11 = (ushort)uVar81 & 0xff;
      uVar12 = (ushort)uVar79 & 0xff;
      bVar6 = ((uVar50 & 0xff) != 0) * (uVar62 < 0x100) * (char)uVar50 - (0xff < uVar62);
      uVar61 = (ushort)bVar6;
      bVar7 = ((uVar77 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar77 - (0xff < uVar10);
      bVar8 = ((uVar81 & 0xff) != 0) * (uVar11 < 0x100) * (char)uVar81 - (0xff < uVar11);
      bVar9 = ((uVar79 & 0xff) != 0) * (uVar12 < 0x100) * (char)uVar79 - (0xff < uVar12);
      bVar2 = ((uVar50 & 0xff) != 0) * (uVar62 < 0x100) * (char)uVar50 - (0xff < uVar62);
      bVar5 = ((uVar77 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar77 - (0xff < uVar10);
      bVar3 = ((uVar81 & 0xff) != 0) * (uVar11 < 0x100) * (char)uVar81 - (0xff < uVar11);
      bVar4 = ((uVar79 & 0xff) != 0) * (uVar12 < 0x100) * (char)uVar79 - (0xff < uVar12);
      uVar62 = (ushort)bVar7;
      uVar10 = (ushort)bVar8;
      uVar11 = (ushort)bVar9;
      uVar12 = (ushort)bVar2;
      uVar60 = (ushort)bVar5;
      uVar13 = (ushort)bVar3;
      auVar63[1] = ((bVar7 != 0) * (uVar62 < 0x100) * bVar7 - (0xff < uVar62)) * '\x02';
      auVar63[0] = ((bVar6 != 0) * (uVar61 < 0x100) * bVar6 - (0xff < uVar61)) * '\x02';
      auVar63[2] = ((bVar8 != 0) * (uVar10 < 0x100) * bVar8 - (0xff < uVar10)) * '\x02';
      auVar63[3] = ((bVar9 != 0) * (uVar11 < 0x100) * bVar9 - (0xff < uVar11)) * '\x02';
      auVar63[4] = ((bVar2 != 0) * (uVar12 < 0x100) * bVar2 - (0xff < uVar12)) * '\x02';
      auVar63[5] = ((bVar5 != 0) * (uVar60 < 0x100) * bVar5 - (0xff < uVar60)) * '\x02';
      auVar63[6] = ((bVar3 != 0) * (uVar13 < 0x100) * bVar3 - (0xff < uVar13)) * '\x02';
      auVar63[7] = ((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4)) * '\x02';
      auVar63[8] = ((bVar6 != 0) * (uVar61 < 0x100) * bVar6 - (0xff < uVar61)) * '\x02';
      auVar63[9] = ((bVar7 != 0) * (uVar62 < 0x100) * bVar7 - (0xff < uVar62)) * '\x02';
      auVar63[10] = ((bVar8 != 0) * (uVar10 < 0x100) * bVar8 - (0xff < uVar10)) * '\x02';
      auVar63[0xb] = ((bVar9 != 0) * (uVar11 < 0x100) * bVar9 - (0xff < uVar11)) * '\x02';
      auVar63[0xc] = ((bVar2 != 0) * (uVar12 < 0x100) * bVar2 - (0xff < uVar12)) * '\x02';
      auVar63[0xd] = ((bVar5 != 0) * (uVar60 < 0x100) * bVar5 - (0xff < uVar60)) * '\x02';
      auVar63[0xe] = ((bVar3 != 0) * (uVar13 < 0x100) * bVar3 - (0xff < uVar13)) * '\x02';
      auVar64 = auVar63 & DAT_0014e9a0._0_15_ | DAT_0014e6c0._0_15_;
      iVar57 = iVar57 + 1;
      auVar66[0xd] = 0;
      auVar66._0_13_ = auVar64._0_13_;
      auVar66[0xe] = auVar64[7];
      auVar17[0xc] = auVar64[6];
      auVar17._0_12_ = auVar64._0_12_;
      auVar17._13_2_ = auVar66._13_2_;
      auVar19[0xb] = 0;
      auVar19._0_11_ = auVar64._0_11_;
      auVar19._12_3_ = auVar17._12_3_;
      auVar21[10] = auVar64[5];
      auVar21._0_10_ = auVar64._0_10_;
      auVar21._11_4_ = auVar19._11_4_;
      auVar23[9] = 0;
      auVar23._0_9_ = auVar64._0_9_;
      auVar23._10_5_ = auVar21._10_5_;
      auVar25[8] = auVar64[4];
      auVar25._0_8_ = auVar64._0_8_;
      auVar25._9_6_ = auVar23._9_6_;
      auVar29._7_8_ = 0;
      auVar29._0_7_ = auVar25._8_7_;
      Var30 = CONCAT81(SUB158(auVar29 << 0x40,7),auVar64[3]);
      auVar43._9_6_ = 0;
      auVar43._0_9_ = Var30;
      auVar31._1_10_ = SUB1510(auVar43 << 0x30,5);
      auVar31[0] = auVar64[2];
      auVar44._11_4_ = 0;
      auVar44._0_11_ = auVar31;
      auVar32._1_12_ = SUB1512(auVar44 << 0x20,3);
      auVar32[0] = auVar64[1];
      uVar62 = CONCAT11(0,auVar64[0]);
      auVar64._2_13_ = auVar32;
      auVar64._0_2_ = uVar62;
      auVar14._10_2_ = 0;
      auVar14._0_10_ = auVar64._0_10_;
      auVar14._12_2_ = (short)Var30;
      uVar48 = CONCAT42(auVar14._10_4_,auVar31._0_2_);
      auVar33._6_8_ = 0;
      auVar33._0_6_ = uVar48;
      uVar51 = 0;
      do {
        uVar1 = puVar49[uVar51];
        uVar75 = (undefined1)(uVar1 >> 0x18);
        uVar76 = CONCAT11(uVar75,uVar75);
        uVar75 = (undefined1)(uVar1 >> 0x10);
        uVar27 = CONCAT35(CONCAT21(uVar76,uVar75),CONCAT14(uVar75,uVar1));
        uVar75 = (undefined1)(uVar1 >> 8);
        uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar75),uVar75);
        sVar78 = CONCAT11((char)uVar1,(char)uVar1);
        uVar52 = CONCAT62(uVar34,sVar78);
        auVar69._8_4_ = 0;
        auVar69._0_8_ = uVar52;
        auVar69._12_2_ = uVar76;
        auVar69._14_2_ = uVar76;
        uVar76 = (undefined2)((ulong)uVar27 >> 0x20);
        auVar68._12_4_ = auVar69._12_4_;
        auVar68._8_2_ = 0;
        auVar68._0_8_ = uVar52;
        auVar68._10_2_ = uVar76;
        auVar67._10_6_ = auVar68._10_6_;
        auVar67._8_2_ = uVar76;
        auVar67._0_8_ = uVar52;
        uVar76 = (undefined2)uVar34;
        auVar35._4_8_ = auVar67._8_8_;
        auVar35._2_2_ = uVar76;
        auVar35._0_2_ = uVar76;
        auVar70._0_4_ = ((int)sVar78 >> 8) - (uint)uVar62;
        auVar70._4_4_ =
             (auVar35._0_4_ >> 0x18) - (int)CONCAT82(SUB148(auVar33 << 0x40,6),auVar32._0_2_);
        auVar70._8_4_ = (auVar67._8_4_ >> 0x18) - (int)uVar48;
        auVar70._12_4_ = (auVar68._12_4_ >> 0x18) - (auVar14._10_4_ >> 0x10);
        auVar83 = packssdw(auVar70,auVar70);
        auVar80 = pmulhw(auVar83,auVar83);
        sVar78 = auVar83._6_2_ * auVar83._6_2_;
        iVar55 = CONCAT22(auVar80._6_2_,sVar78);
        Var45 = CONCAT64(CONCAT42(iVar55,auVar80._4_2_),
                         CONCAT22(auVar83._4_2_ * auVar83._4_2_,sVar78));
        auVar36._4_8_ = (long)((unkuint10)Var45 >> 0x10);
        auVar36._2_2_ = auVar80._2_2_;
        auVar36._0_2_ = auVar83._2_2_ * auVar83._2_2_;
        __base[uVar51 * 2] =
             auVar36._0_4_ + iVar55 +
             CONCAT22(auVar80._0_2_,auVar83._0_2_ * auVar83._0_2_) + (int)((unkuint10)Var45 >> 0x10)
        ;
        __base[uVar51 * 2 + 1] = (int)uVar51;
        uVar51 = uVar51 + 1;
      } while (__nmemb != uVar51);
      qsort(__base,__nmemb,8,iq3_compare_func);
      iVar55 = *__base;
      uVar77 = 1;
      uVar51 = 0;
      do {
        if (iVar55 < __base[uVar51 * 2]) {
          uVar52 = uVar51;
          if (uVar77 == uVar56) break;
          uVar77 = uVar77 + 1;
          iVar55 = __base[uVar51 * 2];
        }
        uVar51 = uVar51 + 1;
        uVar52 = __nmemb;
      } while (__nmemb != uVar51);
      iVar54 = iVar54 + (int)uVar52;
    }
    uVar50 = uVar50 + 1;
  } while (uVar50 != 0x1000);
  puVar58 = (uint16_t *)malloc((long)(iVar57 + iVar54) * 2);
  iq3_data[bVar59].neighbours = puVar58;
  uVar50 = 0;
  uVar77 = 0;
  do {
    if (__s[uVar50] < 0) {
      uVar79 = (uint)uVar50;
      uVar81 = uVar79 >> 9;
      uVar82 = uVar79 >> 6;
      uVar79 = uVar79 >> 3;
      uVar62 = (ushort)uVar50 & 0xff;
      uVar10 = (ushort)uVar79 & 0xff;
      uVar11 = (ushort)uVar82 & 0xff;
      uVar12 = (ushort)uVar81 & 0xff;
      bVar3 = ((uVar50 & 0xff) != 0) * (uVar62 < 0x100) * (char)uVar50 - (0xff < uVar62);
      uVar61 = (ushort)bVar3;
      bVar4 = ((uVar79 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar79 - (0xff < uVar10);
      bVar5 = ((uVar82 & 0xff) != 0) * (uVar11 < 0x100) * (char)uVar82 - (0xff < uVar11);
      bVar2 = ((uVar81 & 0xff) != 0) * (uVar12 < 0x100) * (char)uVar81 - (0xff < uVar12);
      bVar9 = ((uVar50 & 0xff) != 0) * (uVar62 < 0x100) * (char)uVar50 - (0xff < uVar62);
      bVar8 = ((uVar79 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar79 - (0xff < uVar10);
      bVar7 = ((uVar82 & 0xff) != 0) * (uVar11 < 0x100) * (char)uVar82 - (0xff < uVar11);
      bVar6 = ((uVar81 & 0xff) != 0) * (uVar12 < 0x100) * (char)uVar81 - (0xff < uVar12);
      uVar62 = (ushort)bVar4;
      uVar10 = (ushort)bVar5;
      uVar11 = (ushort)bVar2;
      uVar12 = (ushort)bVar9;
      uVar60 = (ushort)bVar8;
      uVar13 = (ushort)bVar7;
      auVar65[1] = ((bVar4 != 0) * (uVar62 < 0x100) * bVar4 - (0xff < uVar62)) * '\x02';
      auVar65[0] = ((bVar3 != 0) * (uVar61 < 0x100) * bVar3 - (0xff < uVar61)) * '\x02';
      auVar65[2] = ((bVar5 != 0) * (uVar10 < 0x100) * bVar5 - (0xff < uVar10)) * '\x02';
      auVar65[3] = ((bVar2 != 0) * (uVar11 < 0x100) * bVar2 - (0xff < uVar11)) * '\x02';
      auVar65[4] = ((bVar9 != 0) * (uVar12 < 0x100) * bVar9 - (0xff < uVar12)) * '\x02';
      auVar65[5] = ((bVar8 != 0) * (uVar60 < 0x100) * bVar8 - (0xff < uVar60)) * '\x02';
      auVar65[6] = ((bVar7 != 0) * (uVar13 < 0x100) * bVar7 - (0xff < uVar13)) * '\x02';
      auVar65[7] = ((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)) * '\x02';
      auVar65[8] = ((bVar3 != 0) * (uVar61 < 0x100) * bVar3 - (0xff < uVar61)) * '\x02';
      auVar65[9] = ((bVar4 != 0) * (uVar62 < 0x100) * bVar4 - (0xff < uVar62)) * '\x02';
      auVar65[10] = ((bVar5 != 0) * (uVar10 < 0x100) * bVar5 - (0xff < uVar10)) * '\x02';
      auVar65[0xb] = ((bVar2 != 0) * (uVar11 < 0x100) * bVar2 - (0xff < uVar11)) * '\x02';
      auVar65[0xc] = ((bVar9 != 0) * (uVar12 < 0x100) * bVar9 - (0xff < uVar12)) * '\x02';
      auVar65[0xd] = ((bVar8 != 0) * (uVar60 < 0x100) * bVar8 - (0xff < uVar60)) * '\x02';
      auVar65[0xe] = ((bVar7 != 0) * (uVar13 < 0x100) * bVar7 - (0xff < uVar13)) * '\x02';
      auVar66 = auVar65 & DAT_0014e9a0._0_15_ | DAT_0014e6c0._0_15_;
      auVar15[0xd] = 0;
      auVar15._0_13_ = auVar66._0_13_;
      auVar15[0xe] = auVar66[7];
      auVar18[0xc] = auVar66[6];
      auVar18._0_12_ = auVar66._0_12_;
      auVar18._13_2_ = auVar15._13_2_;
      auVar20[0xb] = 0;
      auVar20._0_11_ = auVar66._0_11_;
      auVar20._12_3_ = auVar18._12_3_;
      auVar22[10] = auVar66[5];
      auVar22._0_10_ = auVar66._0_10_;
      auVar22._11_4_ = auVar20._11_4_;
      auVar24[9] = 0;
      auVar24._0_9_ = auVar66._0_9_;
      auVar24._10_5_ = auVar22._10_5_;
      auVar26[8] = auVar66[4];
      auVar26._0_8_ = auVar66._0_8_;
      auVar26._9_6_ = auVar24._9_6_;
      auVar37._7_8_ = 0;
      auVar37._0_7_ = auVar26._8_7_;
      Var30 = CONCAT81(SUB158(auVar37 << 0x40,7),auVar66[3]);
      auVar46._9_6_ = 0;
      auVar46._0_9_ = Var30;
      auVar38._1_10_ = SUB1510(auVar46 << 0x30,5);
      auVar38[0] = auVar66[2];
      auVar47._11_4_ = 0;
      auVar47._0_11_ = auVar38;
      auVar39._1_12_ = SUB1512(auVar47 << 0x20,3);
      auVar39[0] = auVar66[1];
      uVar62 = CONCAT11(0,auVar66[0]);
      auVar28._2_13_ = auVar39;
      auVar28._0_2_ = uVar62;
      auVar16._10_2_ = 0;
      auVar16._0_10_ = auVar28._0_10_;
      auVar16._12_2_ = (short)Var30;
      uVar48 = CONCAT42(auVar16._10_4_,auVar38._0_2_);
      auVar40._6_8_ = 0;
      auVar40._0_6_ = uVar48;
      uVar51 = 0;
      do {
        uVar1 = puVar49[uVar51];
        uVar75 = (undefined1)(uVar1 >> 0x18);
        uVar76 = CONCAT11(uVar75,uVar75);
        uVar75 = (undefined1)(uVar1 >> 0x10);
        uVar27 = CONCAT35(CONCAT21(uVar76,uVar75),CONCAT14(uVar75,uVar1));
        uVar75 = (undefined1)(uVar1 >> 8);
        uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar75),uVar75);
        sVar78 = CONCAT11((char)uVar1,(char)uVar1);
        uVar52 = CONCAT62(uVar34,sVar78);
        auVar73._8_4_ = 0;
        auVar73._0_8_ = uVar52;
        auVar73._12_2_ = uVar76;
        auVar73._14_2_ = uVar76;
        uVar76 = (undefined2)((ulong)uVar27 >> 0x20);
        auVar72._12_4_ = auVar73._12_4_;
        auVar72._8_2_ = 0;
        auVar72._0_8_ = uVar52;
        auVar72._10_2_ = uVar76;
        auVar71._10_6_ = auVar72._10_6_;
        auVar71._8_2_ = uVar76;
        auVar71._0_8_ = uVar52;
        uVar76 = (undefined2)uVar34;
        auVar41._4_8_ = auVar71._8_8_;
        auVar41._2_2_ = uVar76;
        auVar41._0_2_ = uVar76;
        auVar74._0_4_ = ((int)sVar78 >> 8) - (uint)uVar62;
        auVar74._4_4_ =
             (auVar41._0_4_ >> 0x18) - (int)CONCAT82(SUB148(auVar40 << 0x40,6),auVar39._0_2_);
        auVar74._8_4_ = (auVar71._8_4_ >> 0x18) - (int)uVar48;
        auVar74._12_4_ = (auVar72._12_4_ >> 0x18) - (auVar16._10_4_ >> 0x10);
        auVar83 = packssdw(auVar74,auVar74);
        auVar80 = pmulhw(auVar83,auVar83);
        sVar78 = auVar83._6_2_ * auVar83._6_2_;
        iVar54 = CONCAT22(auVar80._6_2_,sVar78);
        Var45 = CONCAT64(CONCAT42(iVar54,auVar80._4_2_),
                         CONCAT22(auVar83._4_2_ * auVar83._4_2_,sVar78));
        auVar42._4_8_ = (long)((unkuint10)Var45 >> 0x10);
        auVar42._2_2_ = auVar80._2_2_;
        auVar42._0_2_ = auVar83._2_2_ * auVar83._2_2_;
        __base[uVar51 * 2] =
             auVar42._0_4_ + iVar54 +
             CONCAT22(auVar80._0_2_,auVar83._0_2_ * auVar83._0_2_) + (int)((unkuint10)Var45 >> 0x10)
        ;
        __base[uVar51 * 2 + 1] = (int)uVar51;
        uVar51 = uVar51 + 1;
      } while (__nmemb != uVar51);
      qsort(__base,__nmemb,8,iq3_compare_func);
      lVar53 = (long)(int)uVar77;
      __s[uVar50] = ~uVar77;
      iVar57 = uVar77 + 1;
      iVar54 = *__base;
      uVar77 = grid_size + 1 + uVar77;
      uVar79 = 1;
      uVar51 = 0;
      do {
        if (iVar54 < __base[uVar51 * 2]) {
          if (uVar79 == uVar56) {
            uVar77 = iVar57 + (int)uVar51;
            uVar52 = uVar51;
            break;
          }
          uVar79 = uVar79 + 1;
          iVar54 = __base[uVar51 * 2];
        }
        puVar58[(long)iVar57 + uVar51] = *(uint16_t *)(__base + uVar51 * 2 + 1);
        uVar51 = uVar51 + 1;
        uVar52 = __nmemb;
      } while (__nmemb != uVar51);
      puVar58[lVar53] = (uint16_t)uVar52;
    }
    uVar50 = uVar50 + 1;
    if (uVar50 == 0x1000) {
      free(__base);
      return;
    }
  } while( true );
}

Assistant:

void iq3xs_init_impl(int grid_size) {
    const int gindex = iq3_data_index(grid_size);
    if (iq3_data[gindex].grid) {
        return;
    }
    static const uint16_t kgrid_256[256] = {
            0,     2,     4,     9,    11,    15,    16,    18,    25,    34,    59,    61,    65,    67,    72,    74,
           81,    85,    88,    90,    97,   108,   120,   128,   130,   132,   137,   144,   146,   153,   155,   159,
          169,   175,   189,   193,   199,   200,   202,   213,   248,   267,   287,   292,   303,   315,   317,   321,
          327,   346,   362,   413,   436,   456,   460,   462,   483,   497,   513,   515,   520,   522,   529,   531,
          536,   538,   540,   551,   552,   576,   578,   585,   592,   594,   641,   643,   648,   650,   657,   664,
          698,   704,   706,   720,   729,   742,   758,   769,   773,   808,   848,   852,   870,   889,   901,   978,
          992,  1024,  1026,  1033,  1035,  1040,  1042,  1046,  1049,  1058,  1089,  1091,  1093,  1096,  1098,  1105,
         1112,  1139,  1143,  1144,  1152,  1154,  1161,  1167,  1168,  1170,  1183,  1184,  1197,  1217,  1224,  1228,
         1272,  1276,  1309,  1323,  1347,  1367,  1377,  1404,  1473,  1475,  1486,  1509,  1537,  1544,  1546,  1553,
         1555,  1576,  1589,  1594,  1600,  1602,  1616,  1625,  1636,  1638,  1665,  1667,  1672,  1685,  1706,  1722,
         1737,  1755,  1816,  1831,  1850,  1856,  1862,  1874,  1901,  1932,  1950,  1971,  2011,  2032,  2052,  2063,
         2077,  2079,  2091,  2095,  2172,  2192,  2207,  2208,  2224,  2230,  2247,  2277,  2308,  2345,  2356,  2389,
         2403,  2424,  2501,  2504,  2506,  2520,  2570,  2593,  2616,  2624,  2630,  2646,  2669,  2700,  2714,  2746,
         2754,  2795,  2824,  2835,  2839,  2874,  2882,  2905,  2984,  3028,  3042,  3092,  3108,  3110,  3124,  3153,
         3185,  3215,  3252,  3288,  3294,  3364,  3397,  3434,  3483,  3523,  3537,  3587,  3589,  3591,  3592,  3610,
         3626,  3670,  3680,  3722,  3749,  3754,  3776,  3789,  3803,  3824,  3857,  3873,  3904,  3906,  3924,  3992,
    };
    static const uint16_t kgrid_512[512] = {
            0,     1,     2,     5,     7,     8,     9,    10,    12,    14,    16,    17,    21,    27,    32,    34,
           37,    39,    41,    43,    48,    50,    57,    60,    63,    64,    65,    66,    68,    72,    73,    77,
           80,    83,    87,    89,    93,   100,   113,   117,   122,   128,   129,   133,   135,   136,   139,   142,
          145,   149,   152,   156,   162,   165,   167,   169,   171,   184,   187,   195,   201,   205,   208,   210,
          217,   219,   222,   228,   232,   234,   247,   249,   253,   256,   267,   271,   273,   276,   282,   288,
          291,   297,   312,   322,   324,   336,   338,   342,   347,   353,   357,   359,   374,   379,   390,   393,
          395,   409,   426,   441,   448,   450,   452,   464,   466,   470,   475,   488,   492,   512,   513,   514,
          516,   520,   521,   523,   525,   527,   528,   530,   537,   540,   542,   556,   558,   561,   570,   576,
          577,   579,   582,   584,   588,   593,   600,   603,   609,   616,   618,   632,   638,   640,   650,   653,
          655,   656,   660,   666,   672,   675,   685,   688,   698,   705,   708,   711,   712,   715,   721,   727,
          728,   732,   737,   754,   760,   771,   773,   778,   780,   793,   795,   802,   806,   808,   812,   833,
          840,   843,   849,   856,   858,   873,   912,   916,   919,   932,   934,   961,   963,   968,   970,   977,
          989,   993,  1010,  1016,  1024,  1025,  1027,  1029,  1031,  1032,  1034,  1036,  1038,  1041,  1043,  1047,
         1048,  1050,  1057,  1059,  1061,  1064,  1066,  1079,  1080,  1083,  1085,  1088,  1090,  1096,  1099,  1103,
         1106,  1109,  1113,  1116,  1122,  1129,  1153,  1156,  1159,  1169,  1171,  1176,  1183,  1185,  1195,  1199,
         1209,  1212,  1216,  1218,  1221,  1225,  1234,  1236,  1241,  1243,  1250,  1256,  1270,  1281,  1287,  1296,
         1299,  1306,  1309,  1313,  1338,  1341,  1348,  1353,  1362,  1375,  1376,  1387,  1400,  1408,  1410,  1415,
         1425,  1453,  1457,  1477,  1481,  1494,  1496,  1507,  1512,  1538,  1545,  1547,  1549,  1551,  1554,  1561,
         1563,  1565,  1570,  1572,  1575,  1577,  1587,  1593,  1601,  1603,  1605,  1612,  1617,  1619,  1632,  1648,
         1658,  1662,  1664,  1674,  1680,  1690,  1692,  1704,  1729,  1736,  1740,  1745,  1747,  1751,  1752,  1761,
         1763,  1767,  1773,  1787,  1795,  1801,  1806,  1810,  1817,  1834,  1840,  1844,  1857,  1864,  1866,  1877,
         1882,  1892,  1902,  1915,  1934,  1953,  1985,  1987,  2000,  2002,  2013,  2048,  2052,  2058,  2064,  2068,
         2071,  2074,  2081,  2088,  2104,  2114,  2119,  2121,  2123,  2130,  2136,  2141,  2147,  2153,  2157,  2177,
         2179,  2184,  2189,  2193,  2203,  2208,  2223,  2226,  2232,  2244,  2249,  2251,  2256,  2258,  2265,  2269,
         2304,  2306,  2324,  2335,  2336,  2361,  2373,  2375,  2385,  2418,  2443,  2460,  2480,  2504,  2509,  2520,
         2531,  2537,  2562,  2568,  2572,  2578,  2592,  2596,  2599,  2602,  2614,  2620,  2625,  2627,  2629,  2634,
         2641,  2650,  2682,  2688,  2697,  2707,  2712,  2718,  2731,  2754,  2759,  2760,  2775,  2788,  2793,  2805,
         2811,  2817,  2820,  2832,  2842,  2854,  2890,  2902,  2921,  2923,  2978,  3010,  3012,  3026,  3081,  3083,
         3085,  3097,  3099,  3120,  3136,  3152,  3159,  3188,  3210,  3228,  3234,  3245,  3250,  3256,  3264,  3276,
         3281,  3296,  3349,  3363,  3378,  3392,  3395,  3420,  3440,  3461,  3488,  3529,  3531,  3584,  3588,  3591,
         3600,  3602,  3614,  3616,  3628,  3634,  3650,  3657,  3668,  3683,  3685,  3713,  3716,  3720,  3726,  3729,
         3736,  3753,  3778,  3802,  3805,  3819,  3841,  3845,  3851,  3856,  3880,  3922,  3938,  3970,  3993,  4032,
    };

    const int kmap_size = 4096;
    const int nwant = grid_size == 256 ? 2 : 3;
    const uint16_t * kgrid = grid_size == 256 ? kgrid_256 : kgrid_512;
    uint32_t * kgrid_q3xs;
    int      * kmap_q3xs;
    uint16_t * kneighbors_q3xs;

    //printf("================================================================= %s(grid_size = %d)\n", __func__, grid_size);
    uint32_t * the_grid = (uint32_t *)malloc(grid_size*sizeof(uint32_t));
    for (int k = 0; k < grid_size; ++k) {
        int8_t * pos = (int8_t *)(the_grid + k);
        for (int i = 0; i < 4; ++i) {
            int l = (kgrid[k] >> 3*i) & 0x7;
            pos[i] = 2*l + 1;
        }
    }
    kgrid_q3xs = the_grid;
    iq3_data[gindex].grid = the_grid;
    kmap_q3xs = (int *)malloc(kmap_size*sizeof(int));
    iq3_data[gindex].map = kmap_q3xs;
    for (int i = 0; i < kmap_size; ++i) kmap_q3xs[i] = -1;
    uint32_t aux32;
    uint8_t * aux8 = (uint8_t *)&aux32;
    for (int i = 0; i < grid_size; ++i) {
        aux32 = kgrid_q3xs[i];
        uint16_t index = 0;
        for (int k=0; k<4; ++k) {
            uint16_t q = (aux8[k] - 1)/2;
            index |= (q << 3*k);
        }
        kmap_q3xs[index] = i;
    }
    int8_t pos[4];
    int * dist2 = (int *)malloc(2*grid_size*sizeof(int));
    int num_neighbors = 0, num_not_in_map = 0;
    for (int i = 0; i < kmap_size; ++i) {
        if (kmap_q3xs[i] >= 0) continue;
        ++num_not_in_map;
        for (int k = 0; k < 4; ++k) {
            int l = (i >> 3*k) & 0x7;
            pos[k] = 2*l + 1;
        }
        for (int j = 0; j < grid_size; ++j) {
            const int8_t * pg = (const int8_t *)(kgrid_q3xs + j);
            int d2 = 0;
            for (int k = 0; k < 4; ++k) d2 += (pg[k] - pos[k])*(pg[k] - pos[k]);
            dist2[2*j+0] = d2;
            dist2[2*j+1] = j;
        }
        qsort(dist2, grid_size, 2*sizeof(int), iq3_compare_func);
        int n = 0; int d2 = dist2[0];
        int nhave = 1;
        for (int j = 0; j < grid_size; ++j) {
            if (dist2[2*j] > d2) {
                if (nhave == nwant) break;
                d2 = dist2[2*j];
                ++nhave;
            }
            ++n;
        }
        num_neighbors += n;
    }
    //printf("%s: %d neighbours in total\n", __func__, num_neighbors);
    kneighbors_q3xs = (uint16_t *)malloc((num_neighbors + num_not_in_map)*sizeof(uint16_t));
    iq3_data[gindex].neighbours = kneighbors_q3xs;
    int counter = 0;
    for (int i = 0; i < kmap_size; ++i) {
        if (kmap_q3xs[i] >= 0) continue;
        for (int k = 0; k < 4; ++k) {
            int l = (i >> 3*k) & 0x7;
            pos[k] = 2*l + 1;
        }
        for (int j = 0; j < grid_size; ++j) {
            const int8_t * pg = (const int8_t *)(kgrid_q3xs + j);
            int d2 = 0;
            for (int k = 0; k < 4; ++k) d2 += (pg[k] - pos[k])*(pg[k] - pos[k]);
            dist2[2*j+0] = d2;
            dist2[2*j+1] = j;
        }
        qsort(dist2, grid_size, 2*sizeof(int), iq3_compare_func);
        kmap_q3xs[i] = -(counter + 1);
        int d2 = dist2[0];
        uint16_t * start = &kneighbors_q3xs[counter++];
        int n = 0, nhave = 1;
        for (int j = 0; j < grid_size; ++j) {
            if (dist2[2*j] > d2) {
                if (nhave == nwant) break;
                d2 = dist2[2*j];
                ++nhave;
            }
            kneighbors_q3xs[counter++] = dist2[2*j+1];
            ++n;
        }
        *start = n;
    }
    free(dist2);
}